

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

float memory_tree_ns::return_reward_from_node
                (memory_tree *b,single_learner *base,uint32_t cn,example *ec,float weight)

{
  polyprediction *ppVar1;
  uint64_t *puVar2;
  uint32_t uVar3;
  example *peVar4;
  wclass *pwVar5;
  wclass *pwVar6;
  wclass *pwVar7;
  size_t sVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  size_t sVar12;
  uint64_t uVar13;
  int64_t iVar14;
  polylabel *ppVar15;
  node *pnVar16;
  wclass *pwVar17;
  ulong uVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  labels preds;
  labels multilabels;
  labels preds_1;
  v_array<unsigned_int> leaf_labs;
  label_t local_100;
  float *local_c8;
  float *pfStack_c0;
  float *local_b8;
  size_t sStack_b0;
  label_t local_a8;
  wclass *pwStack_a0;
  wclass *local_98;
  size_t sStack_90;
  v_array<unsigned_int> local_58;
  
  uVar18 = (ulong)cn;
  ppVar15 = &ec->l;
  ppVar1 = &ec->pred;
  if (b->oas == 0) {
    local_100 = ppVar15->multi;
    fVar20 = ppVar1->scalar;
  }
  else {
    local_a8 = ppVar15->multi;
    pwStack_a0 = (ec->l).cs.costs._end;
    local_98 = (ec->l).cs.costs.end_array;
    sStack_90 = (ec->l).cs.costs.erase_count;
    local_c8 = (ppVar1->scalars)._begin;
    pfStack_c0 = (ec->pred).scalars._end;
    local_b8 = (ec->pred).scalars.end_array;
    sStack_b0 = (ec->pred).scalars.erase_count;
    fVar20 = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar16 = (b->nodes)._begin;
  if (pnVar16[uVar18].internal != -1) {
    pnVar16 = pnVar16 + uVar18;
    uVar13 = (ec->super_example_predict).ft_offset;
    do {
      uVar3 = pnVar16->base_router;
      (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar3 + uVar13;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar13 = (ec->super_example_predict).ft_offset - (ulong)(uVar3 * *(int *)(base + 0xe0));
      (ec->super_example_predict).ft_offset = uVar13;
      pnVar16 = (b->nodes)._begin;
      cn = (&pnVar16[uVar18].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      uVar18 = (ulong)cn;
      pnVar16 = pnVar16 + uVar18;
    } while (pnVar16->internal != -1);
  }
  if (b->oas == 0) {
    (ec->l).multi = local_100;
    (ec->pred).scalar = fVar20;
  }
  else {
    (ec->pred).scalars.end_array = local_b8;
    (ec->pred).scalars.erase_count = sStack_b0;
    (ec->pred).scalars._begin = local_c8;
    (ec->pred).scalars._end = pfStack_c0;
    (ec->l).cs.costs.end_array = local_98;
    (ec->l).cs.costs.erase_count = sStack_90;
    ppVar15->multi = local_a8;
    (ec->l).cs.costs._end = pwStack_a0;
  }
  iVar14 = pick_nearest(b,base,cn,ec);
  if (b->oas == 0) {
    fVar20 = 0.0;
    if ((iVar14 != -1) && (((b->examples)._begin[iVar14]->l).multi.label == (ppVar15->multi).label))
    {
      fVar20 = 1.0;
    }
  }
  else if (iVar14 == -1) {
    fVar20 = 0.0;
  }
  else {
    fVar20 = F1_score_for_two_examples(ec,(b->examples)._begin[iVar14]);
  }
  b->total_num_queries = b->total_num_queries + 1;
  if ((iVar14 != -1) && (b->learn_at_leaf == 1)) {
    fVar21 = normalized_linear_prod(b,ec,(b->examples)._begin[iVar14]);
    diag_kronecker_product_test(ec,(b->examples)._begin[iVar14],b->kprod_ec,b->oas);
    peVar4 = b->kprod_ec;
    (peVar4->l).simple.label = fVar20;
    (peVar4->l).simple.weight = 1.0;
    (peVar4->l).simple.initial = -fVar21;
    b->kprod_ec->weight = weight;
    peVar4 = b->kprod_ec;
    iVar19 = (int)b->max_routers;
    puVar2 = &(peVar4->super_example_predict).ft_offset;
    *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar19);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar4);
    puVar2 = &(peVar4->super_example_predict).ft_offset;
    *puVar2 = *puVar2 - (ulong)(uint)(iVar19 * *(int *)(base + 0xe0));
  }
  if (b->oas == 1) {
    local_58.end_array = (uint *)0x0;
    local_58.erase_count = 0;
    local_58._begin = (uint *)0x0;
    local_58._end = (uint *)0x0;
    collect_labels_from_leaf(b,cn,&local_58);
    pwVar5 = (ec->l).cs.costs._begin;
    pwVar6 = (ec->l).cs.costs._end;
    pwVar7 = (ec->l).cs.costs.end_array;
    sVar8 = (ec->l).cs.costs.erase_count;
    pfVar9 = (ec->pred).scalars._begin;
    pfVar10 = (ec->pred).scalars._end;
    pfVar11 = (ec->pred).scalars.end_array;
    sVar12 = (ec->pred).scalars.erase_count;
    *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
    if (local_58._end != local_58._begin) {
      uVar18 = 0;
      do {
        (ppVar15->multi).label = 0xbf800000;
        fVar21 = (float)local_58._begin[uVar18];
        for (pwVar17 = pwVar5; pwVar17 != pwVar6; pwVar17 = (wclass *)&pwVar17->class_index) {
          if (pwVar17->x == fVar21) {
            (ppVar15->multi).label = 0x3f800000;
            fVar21 = (float)local_58._begin[uVar18];
            break;
          }
        }
        iVar19 = (int)b->max_routers + (int)fVar21 + 1;
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar19);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 - (ulong)(uint)(iVar19 * *(int *)(base + 0xe0));
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_58._end - (long)local_58._begin >> 2));
    }
    (ec->pred).scalars.end_array = pfVar11;
    (ec->pred).scalars.erase_count = sVar12;
    (ppVar1->scalars)._begin = pfVar9;
    (ec->pred).scalars._end = pfVar10;
    (ec->l).cs.costs._begin = pwVar5;
    (ec->l).cs.costs._end = pwVar6;
    (ec->l).cs.costs.end_array = pwVar7;
    (ec->l).cs.costs.erase_count = sVar8;
  }
  return fVar20;
}

Assistant:

float return_reward_from_node(memory_tree& b, single_learner& base, uint32_t cn, example& ec, float weight = 1.f){
        //example& ec = *b.examples[ec_array_index];
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas ==false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }
	ec.l.simple = {FLT_MAX, 1., 0.0};
        while(b.nodes[cn].internal != -1){
            base.predict(ec, b.nodes[cn].base_router);
            float prediction = ec.pred.scalar;
            cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //get to leaf now:
	    int64_t closest_ec = 0;
        float reward = 0.f;
        closest_ec = pick_nearest(b, base, cn, ec); //no randomness for picking example.
        if (b.oas == false){
            if ((closest_ec != -1) && (b.examples[closest_ec]->l.multi.label == ec.l.multi.label))
                reward = 1.f;
        }
        else{
            if (closest_ec != -1)
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
        }
        b.total_num_queries++;

        if (b.learn_at_leaf == true && closest_ec != -1){
        	float score = normalized_linear_prod(b, &ec, b.examples[closest_ec]);
            diag_kronecker_product_test(ec, *b.examples[closest_ec], *b.kprod_ec, b.oas );
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight;
            base.learn(*b.kprod_ec, b.max_routers);
        }

        if (b.oas == true)
            train_one_against_some_at_leaf(b,base, cn,ec); ///learn the inference procedure anyway

        return reward;
    }